

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Sampling_InvertUniformSphere_Test::TestBody(Sampling_InvertUniformSphere_Test *this)

{
  undefined1 auVar1 [16];
  Message *pMVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Vector3f VVar9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  Point2f u;
  AssertHelper local_a8;
  AssertionResult gtest_ar;
  Point2f up;
  Tuple3<pbrt::Vector3,_float> local_88;
  Uniform2DIter __begin1;
  Uniform2DIter __end1;
  IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter> local_48 [2];
  undefined8 local_40;
  undefined8 local_38;
  undefined1 extraout_var [56];
  undefined1 auVar8 [56];
  undefined1 extraout_var_00 [56];
  
  local_48[0].n = 1000;
  local_40 = 0;
  local_38 = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter>::begin
            (&__begin1,local_48);
  pbrt::detail::IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter>::end
            (&__end1,local_48);
  for (; __begin1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
         super_IndexingIterator<pbrt::detail::Uniform2DIter>.i !=
         __end1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
         super_IndexingIterator<pbrt::detail::Uniform2DIter>.i;
      __begin1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
      super_IndexingIterator<pbrt::detail::Uniform2DIter>.i =
           __begin1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
           super_IndexingIterator<pbrt::detail::Uniform2DIter>.i + 1) {
    auVar5._0_8_ = pbrt::detail::Uniform2DIter::operator*(&__begin1);
    auVar5._8_56_ = extraout_var;
    u.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar5._0_16_);
    auVar8 = extraout_var;
    VVar9 = pbrt::SampleUniformSphere(&u);
    local_88.z = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar8;
    local_88._0_8_ = vmovlps_avx(auVar6._0_16_);
    auVar7._0_8_ = pbrt::InvertUniformSphereSample((Vector3f *)&local_88);
    auVar7._8_56_ = extraout_var_00;
    up.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7._0_16_);
    local_b8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x3f50624dd2f1a9fc;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar4 = vandps_avx512vl(ZEXT416((uint)(u.super_Tuple2<pbrt::Point2,_float>.x - auVar7._0_4_)),
                             auVar4);
    local_a8.data_._0_4_ = auVar4._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar,"std::abs(u.x - up.x)","1e-3",(float *)&local_a8,
               (double *)&local_b8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_b8);
      std::operator<<((ostream *)(local_b8.ptr_ + 0x10),"u ");
      pbrt::operator<<((ostream *)(local_b8.ptr_ + 0x10),&u);
      std::operator<<((ostream *)(local_b8.ptr_ + 0x10)," -> ");
      pMVar2 = testing::Message::operator<<((Message *)&local_b8,(Vector3<float> *)&local_88);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [5])" -> ");
      pMVar2 = testing::Message::operator<<(pMVar2,&up);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x5d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_b8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_b8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x3f50624dd2f1a9fc;
    auVar1._8_4_ = 0x7fffffff;
    auVar1._0_8_ = 0x7fffffff7fffffff;
    auVar1._12_4_ = 0x7fffffff;
    auVar4 = vandps_avx512vl(ZEXT416((uint)(u.super_Tuple2<pbrt::Point2,_float>.y -
                                           up.super_Tuple2<pbrt::Point2,_float>.y)),auVar1);
    local_a8.data_._0_4_ = auVar4._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar,"std::abs(u.y - up.y)","1e-3",(float *)&local_a8,
               (double *)&local_b8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_b8);
      std::operator<<((ostream *)(local_b8.ptr_ + 0x10),"u ");
      pbrt::operator<<((ostream *)(local_b8.ptr_ + 0x10),&u);
      std::operator<<((ostream *)(local_b8.ptr_ + 0x10)," -> ");
      pMVar2 = testing::Message::operator<<((Message *)&local_b8,(Vector3<float> *)&local_88);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [5])" -> ");
      pMVar2 = testing::Message::operator<<(pMVar2,&up);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x5e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_b8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(Sampling, InvertUniformSphere) {
    for (Point2f u : Uniform2D(1000)) {
        Vector3f v = SampleUniformSphere(u);
        Point2f up = InvertUniformSphereSample(v);

        EXPECT_LT(std::abs(u.x - up.x), 1e-3) << "u " << u << " -> " << v << " -> " << up;
        EXPECT_LT(std::abs(u.y - up.y), 1e-3) << "u " << u << " -> " << v << " -> " << up;
    }
}